

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

void __thiscall cppcms::application_specific_pool::_pool_policy::~_pool_policy(_pool_policy *this)

{
  ~_pool_policy(this);
  operator_delete(this);
  return;
}

Assistant:

~_pool_policy()
	{
		for(size_t i=0;i<size_;i++)
			delete apps_[i];
	}